

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

bool __thiscall
QGraphicsScenePrivate::itemAcceptsHoverEvents_helper
          (QGraphicsScenePrivate *this,QGraphicsItem *item)

{
  bool bVar1;
  QGraphicsItemPrivate *pQVar2;
  QGraphicsWidgetPrivate *in_RSI;
  QGraphicsItem **in_stack_00000010;
  byte local_11;
  
  pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&(in_RSI->super_QGraphicsItemPrivate).extras);
  if ((*(ulong *)&pQVar2->field_0x160 >> 10 & 1) == 0) {
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)&(in_RSI->super_QGraphicsItemPrivate).extras);
    local_11 = 0;
    if ((*(ulong *)&pQVar2->field_0x160 & 0x1000000) == 0) goto LAB_009d2929;
    QGraphicsWidget::d_func((QGraphicsWidget *)0x9d28fe);
    bVar1 = QGraphicsWidgetPrivate::hasDecoration(in_RSI);
    local_11 = 0;
    if (!bVar1) goto LAB_009d2929;
  }
  bVar1 = QGraphicsItem::isBlockedByModalPanel(item,in_stack_00000010);
  local_11 = bVar1 ^ 0xff;
LAB_009d2929:
  return (bool)(local_11 & 1);
}

Assistant:

bool QGraphicsScenePrivate::itemAcceptsHoverEvents_helper(const QGraphicsItem *item) const
{
    return (item->d_ptr->acceptsHover
            || (item->d_ptr->isWidget
                && static_cast<const QGraphicsWidget *>(item)->d_func()->hasDecoration()))
           && !item->isBlockedByModalPanel();
}